

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O1

ValueType * __thiscall
HighsHashTree<int,_HighsImplications::VarBound>::InnerLeaf<1>::find_entry
          (InnerLeaf<1> *this,uint64_t fullHash,int hashPos,int *key)

{
  ulong uVar1;
  ulong uVar2;
  ValueType *pVVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  int *piVar9;
  bool bVar10;
  
  uVar6 = fullHash >> ((char)hashPos * -6 + 0x30U & 0x3f);
  uVar2 = uVar6 >> 10;
  uVar1 = (this->occupation).occupation;
  if ((uVar1 >> (uVar2 & 0x3f) & 1) == 0) {
    return (ValueType *)0x0;
  }
  lVar4 = POPCOUNT(uVar1 >> ((byte)uVar2 & 0x3f));
  uVar6 = uVar6 & 0xffff;
  lVar7 = (ulong)(uint)((int)lVar4 * 8) * -3 + -0x18;
  do {
    lVar5 = lVar4;
    lVar7 = lVar7 + -0x18;
    lVar4 = lVar5 + 1;
  } while (uVar6 < (this->hashes)._M_elems[lVar5 + -1]);
  iVar8 = this->size;
  if ((iVar8 + 2 == (int)lVar4) || ((this->hashes)._M_elems[lVar5 + -1] != uVar6)) {
    bVar10 = false;
    iVar8 = (int)lVar5 + -1;
  }
  else {
    piVar9 = (int *)((long)this - lVar7);
    do {
      bVar10 = *key == *piVar9;
      if (bVar10) {
        iVar8 = (int)lVar4 + -2;
        goto LAB_002acc1b;
      }
      if (iVar8 + 1 == (int)lVar4) goto LAB_002acc1b;
      lVar7 = lVar4 + 1;
      piVar9 = piVar9 + 6;
      lVar5 = lVar4 + -1;
      lVar4 = lVar7;
    } while ((this->hashes)._M_elems[lVar5] == uVar6);
    iVar8 = (int)lVar7 + -2;
  }
LAB_002acc1b:
  pVVar3 = (ValueType *)0x0;
  if (bVar10) {
    pVVar3 = &(this->entries)._M_elems[iVar8].value_;
  }
  return pVVar3;
}

Assistant:

ValueType* find_entry(uint64_t fullHash, int hashPos, const K& key) {
      uint16_t hash = get_hash_chunks16(fullHash, hashPos);
      uint8_t hashChunk = get_first_chunk16(hash);
      if (!occupation.test(hashChunk)) return nullptr;

      int pos = occupation.num_set_until(hashChunk) - 1;
      while (hashes[pos] > hash) ++pos;

      if (find_key(key, hash, pos)) return &entries[pos].value();

      return nullptr;
    }